

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void QApplicationPrivate::setFocusWidget(QWidget *focus,FocusReason reason)

{
  QWidget *this;
  QWidget *pQVar1;
  QGraphicsProxyWidget *pQVar2;
  int *piVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QWidget *local_68;
  QWidget *local_60;
  undefined1 *local_58;
  QWidget **ppQStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (focus != (QWidget *)0x0) {
    pQVar1 = QWidget::window(focus);
    pQVar2 = QWidget::graphicsProxyWidget(pQVar1);
    pQVar1 = hidden_focus_widget;
    if (pQVar2 != (QGraphicsProxyWidget *)0x0) goto LAB_002bbbf7;
  }
  hidden_focus_widget = (QWidget *)0x0;
  pQVar1 = hidden_focus_widget;
  if (focus_widget == focus) goto LAB_002bbbf7;
  if (focus == (QWidget *)0x0) {
LAB_002bba33:
    if (reason == ShortcutFocusReason && focus != (QWidget *)0x0) {
LAB_002bba44:
      pQVar1 = QWidget::window(focus);
      QWidget::setAttribute(pQVar1,WA_KeyboardFocusChange,true);
    }
  }
  else {
    pQVar1 = focus;
    if ((focus->data->widget_attributes & 0x10000) != 0) goto LAB_002bbbf7;
    if (1 < reason - TabFocusReason) goto LAB_002bba33;
    if ((focus != (QWidget *)0x0 && reason == ShortcutFocusReason) || (qt_in_tab_key_event != false)
       ) goto LAB_002bba44;
  }
  this = focus_widget;
  focus_widget = focus;
  if (focus != (QWidget *)0x0) {
    QWidgetPrivate::setFocus_sys(*(QWidgetPrivate **)&focus->field_0x8);
  }
  pQVar1 = hidden_focus_widget;
  if (reason != NoFocusReason) {
    if (this != (QWidget *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      ppQStack_50 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusOut,reason);
      piVar3 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this->super_QObject);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
      if (piVar3 != (int *)0x0) {
        if (piVar3[1] != 0) {
          pQVar4 = &QWidget::style(this)->super_QObject;
          QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_58);
        }
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            operator_delete(piVar3);
          }
        }
      }
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if ((focus != (QWidget *)0x0) && (focus_widget == focus)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      ppQStack_50 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusIn,reason);
      piVar3 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&focus->super_QObject);
      QCoreApplication::sendEvent(&focus->super_QObject,(QEvent *)&local_58);
      if (piVar3 != (int *)0x0) {
        if (piVar3[1] != 0) {
          pQVar4 = &QWidget::style(focus)->super_QObject;
          QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_58);
        }
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            operator_delete(piVar3);
          }
        }
      }
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    ppQStack_50 = &local_60;
    local_60 = this;
    local_68 = focus_widget;
    local_58 = (undefined1 *)0x0;
    local_48 = (undefined1 *)&local_68;
    QMetaObject::activate(QCoreApplication::self,&QApplication::staticMetaObject,0,&local_58);
    pQVar1 = hidden_focus_widget;
  }
LAB_002bbbf7:
  hidden_focus_widget = pQVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setFocusWidget(QWidget *focus, Qt::FocusReason reason)
{
#if QT_CONFIG(graphicsview)
    if (focus && focus->window()->graphicsProxyWidget())
        return;
#endif

    hidden_focus_widget = nullptr;

    if (focus != focus_widget) {
        if (focus && focus->isHidden()) {
            hidden_focus_widget = focus;
            return;
        }

        if (focus && (reason == Qt::BacktabFocusReason || reason == Qt::TabFocusReason)
            && qt_in_tab_key_event)
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        else if (focus && reason == Qt::ShortcutFocusReason) {
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        QWidget *prev = focus_widget;
        focus_widget = focus;

        if (focus_widget)
            focus_widget->d_func()->setFocus_sys();

        if (reason != Qt::NoFocusReason) {

            //send events
            if (prev) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keyboardNavigationEnabled()) {
                    if (prev->hasEditFocus() && reason != Qt::PopupFocusReason)
                        prev->setEditFocus(false);
                }
#endif
                QFocusEvent out(QEvent::FocusOut, reason);
                QPointer<QWidget> that = prev;
                QCoreApplication::sendEvent(prev, &out);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &out);
            }
            if (focus && QApplicationPrivate::focus_widget == focus) {
                QFocusEvent in(QEvent::FocusIn, reason);
                QPointer<QWidget> that = focus;
                QCoreApplication::sendEvent(focus, &in);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &in);
            }
            emit qApp->focusChanged(prev, focus_widget);
        }
    }
}